

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

xmlChar * xmlStrndup(xmlChar *cur,int len)

{
  xmlChar *ret;
  int len_local;
  xmlChar *cur_local;
  
  if ((cur == (xmlChar *)0x0) || (len < 0)) {
    cur_local = (xmlChar *)0x0;
  }
  else {
    cur_local = (xmlChar *)(*xmlMalloc)((long)len + 1);
    if (cur_local == (xmlChar *)0x0) {
      cur_local = (xmlChar *)0x0;
    }
    else {
      memcpy(cur_local,cur,(long)len);
      cur_local[len] = '\0';
    }
  }
  return cur_local;
}

Assistant:

xmlChar *
xmlStrndup(const xmlChar *cur, int len) {
    xmlChar *ret;

    if ((cur == NULL) || (len < 0)) return(NULL);
    ret = xmlMalloc((size_t) len + 1);
    if (ret == NULL) {
        return(NULL);
    }
    memcpy(ret, cur, len);
    ret[len] = 0;
    return(ret);
}